

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Itemset.cc
# Opt level: O2

void __thiscall Itemset::print_idlist(Itemset *this,ostream *idlstrm)

{
  Array *pAVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  uint index;
  int iVar5;
  
  pAVar1 = (this->theIval).super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((pAVar1 != (Array *)0x0) && (0 < pAVar1->theSize)) {
    index = 0;
    iVar2 = Array::operator[](pAVar1,0);
    do {
      iVar5 = 0;
      while( true ) {
        pAVar1 = (this->theIval).super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (pAVar1->theSize <= (int)index) {
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)idlstrm,iVar2);
          poVar4 = std::operator<<(poVar4," ");
          std::ostream::operator<<((ostream *)poVar4,iVar5);
          return;
        }
        iVar3 = Array::operator[](pAVar1,index);
        if (iVar2 != iVar3) break;
        iVar5 = iVar5 + 1;
        index = index + 2;
      }
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)idlstrm,iVar2);
      poVar4 = std::operator<<(poVar4," ");
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar5);
      std::operator<<(poVar4," ");
      iVar2 = Array::operator[]((this->theIval).
                                super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_ptr,index);
    } while( true );
  }
  return;
}

Assistant:

void Itemset::print_idlist(ostream& idlstrm) {
    int i, cid, cnt;

    if (theIval && theIval->size() > 0) {
        cid = (*theIval)[0];
        cnt = 0;
        for (i = 0; i <theIval->size();) {
            if (cid == (*theIval)[i]) {
                cnt++;
                i += 2;
            } else {
                idlstrm << cid << " " << cnt << " ";
                cid = (*theIval)[i];
                cnt = 0;
            }
        }
        idlstrm << cid << " " << cnt;
    }
}